

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  int iVar1;
  FileDescriptor *pFVar2;
  int i;
  long lVar3;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar4;
  FileDescriptor *local_30;
  
  if ((file != (FileDescriptor *)0x0) &&
     (local_30 = file,
     pVar4 = std::
             _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
             ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                       ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                         *)&this->dependencies_,&local_30),
     (local_30 != (FileDescriptor *)0x0 & pVar4.second) == 1)) {
    lVar3 = 0;
    do {
      pFVar2 = local_30;
      if (*(int *)(local_30 + 0x38) <= lVar3) {
        return;
      }
      iVar1 = *(int *)(*(long *)(local_30 + 0x40) + lVar3 * 4);
      if (*(GoogleOnceDynamic **)(local_30 + 0x30) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                  (*(GoogleOnceDynamic **)(local_30 + 0x30),FileDescriptor::DependenciesOnceInit,
                   local_30);
      }
      RecordPublicDependencies
                (this,*(FileDescriptor **)(*(long *)(pFVar2 + 0x20) + (long)iVar1 * 8));
      lVar3 = lVar3 + 1;
    } while (local_30 != (FileDescriptor *)0x0);
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == NULL || !dependencies_.insert(file).second) return;
  for (int i = 0; file != NULL && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}